

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O1

void __thiscall
p2t::Sweep::FlipScanEdgeEvent
          (Sweep *this,SweepContext *tcx,Point *ep,Point *eq,Triangle *flip_triangle,Triangle *t,
          Point *p)

{
  bool bVar1;
  Triangle *this_00;
  Point *pd;
  Point *pb;
  Point *pc;
  Point *this_01;
  
  while( true ) {
    this_00 = Triangle::NeighborAcross(t,p);
    pd = Triangle::OppositePoint(this_00,t,p);
    pb = Triangle::PointCCW(flip_triangle,eq);
    pc = Triangle::PointCW(flip_triangle,eq);
    this_01 = eq;
    bVar1 = InScanArea(eq,pb,pc,pd);
    if (bVar1) break;
    p = NextFlipPoint((Sweep *)this_01,ep,eq,this_00,pd);
    t = this_00;
  }
  FlipEdgeEvent(this,tcx,eq,pd,this_00,pd);
  return;
}

Assistant:

void Sweep::FlipScanEdgeEvent(SweepContext& tcx, Point& ep, Point& eq, Triangle& flip_triangle,
                              Triangle& t, Point& p)
{
  Triangle& ot = t.NeighborAcross(p);
  Point& op = *ot.OppositePoint(t, p);

  if (InScanArea(eq, *flip_triangle.PointCCW(eq), *flip_triangle.PointCW(eq), op)) {
    // flip with new edge op->eq
    FlipEdgeEvent(tcx, eq, op, &ot, op);
    // TODO: Actually I just figured out that it should be possible to
    //       improve this by getting the next ot and op before the the above
    //       flip and continue the flipScanEdgeEvent here
    // set new ot and op here and loop back to inScanArea test
    // also need to set a new flip_triangle first
    // Turns out at first glance that this is somewhat complicated
    // so it will have to wait.
  } else{
    Point& newP = NextFlipPoint(ep, eq, ot, op);
    FlipScanEdgeEvent(tcx, ep, eq, flip_triangle, ot, newP);
  }
}